

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_utils.c
# Opt level: O1

RK_S32 mpi_dec_test_cmd_deinit(MpiDecTestCmd *cmd)

{
  if (cmd != (MpiDecTestCmd *)0x0) {
    if (cmd->reader != (FileReader)0x0) {
      reader_deinit(cmd->reader);
      cmd->reader = (FileReader)0x0;
    }
    if (cmd->file_slt != (char *)0x0) {
      mpp_osal_free("mpi_dec_test_cmd_deinit");
    }
    cmd->file_slt = (char *)0x0;
    if (cmd->fps != (FpsCalc)0x0) {
      fps_calc_deinit(cmd->fps);
      cmd->fps = (FpsCalc)0x0;
    }
  }
  return 0;
}

Assistant:

RK_S32 mpi_dec_test_cmd_deinit(MpiDecTestCmd* cmd)
{
    if (!cmd)
        return 0;

    if (cmd->reader) {
        reader_deinit(cmd->reader);
        cmd->reader = NULL;
    }

    MPP_FREE(cmd->file_slt);

    if (cmd->fps) {
        fps_calc_deinit(cmd->fps);
        cmd->fps = NULL;
    }

    return 0;
}